

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_carith.c
# Opt level: O3

int lj_carith_op(lua_State *L,MMS mm)

{
  long *plVar1;
  ushort uVar2;
  uint uVar3;
  MMS mm_00;
  CTypeID CVar4;
  CTSize CVar5;
  long lVar6;
  CType *pCVar7;
  CType *pCVar8;
  void *pvVar9;
  cTValue *tv;
  TValue *pTVar10;
  GCstr *pGVar11;
  long lVar12;
  CType *pCVar13;
  int iVar14;
  TValue TVar15;
  long lVar16;
  uint uVar17;
  ErrMsg em;
  undefined4 in_register_00000034;
  ulong uVar18;
  CTState *pCVar19;
  TValue TVar20;
  bool bVar21;
  lua_State *plVar22;
  CType *pCVar23;
  bool bVar24;
  uint64_t u0;
  CDArith ca;
  ulong local_98 [2];
  lua_State *local_88;
  ulong local_80;
  CTState *local_78;
  undefined8 local_70;
  int local_64;
  TValue local_60 [2];
  CType *local_50 [2];
  ulong *local_40;
  ulong local_38;
  
  local_70 = CONCAT44(in_register_00000034,mm);
  pCVar19 = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x194);
  pCVar19->L = L;
  TVar15 = (TValue)L->base;
  local_88 = L;
  if (L->top <= (TValue *)(TVar15.u64 + 8)) {
    lj_err_argt(L,1,10);
  }
  local_64 = 1;
  pTVar10 = local_60;
  bVar24 = true;
  lVar6 = 8;
  uVar18 = 0;
  local_40 = local_98;
  local_78 = pCVar19;
  do {
    pCVar13 = local_50[0];
    uVar3 = *(uint32_t *)(TVar15.u64 + 4);
    if (uVar3 == 0xfffffff5) {
      uVar2 = *(ushort *)((ulong)*(uint *)TVar15 + 6);
      pCVar8 = pCVar19->tab;
      uVar3 = pCVar8[uVar2].info;
      TVar20.u64 = (ulong)*(uint *)TVar15 + 8;
      if (uVar3 >> 0x1c == 6) {
        TVar20.u64 = *TVar20.u64;
        local_38 = uVar18;
        CVar4 = lj_ctype_intern(pCVar19,uVar2 | 0x20030000,8);
        pCVar23 = local_78->tab;
        pCVar7 = pCVar23 + CVar4;
        uVar18 = local_38;
        pCVar19 = local_78;
        if (!bVar24) {
          local_50[0] = (CType *)((long)&pCVar23->info +
                                 ((long)pCVar13 - (long)pCVar8 & 0xffffffff0U));
        }
      }
      else {
        pCVar7 = pCVar8 + uVar2;
        pCVar23 = pCVar8;
        if (uVar3 >> 0x1c == 2) {
          if (pCVar7->size == 4) {
            uVar17 = *(uint *)TVar20;
            TVar20.field_2.it = 0;
            TVar20.u64._0_4_ = uVar17;
          }
          else {
            TVar20.u64 = *TVar20.u64;
          }
          if ((uVar3 & 0xf0800000) == 0x20800000) {
            pCVar7 = (CType *)((long)&pCVar8->info + (ulong)((uVar3 & 0xffff) << 4));
          }
        }
      }
      pCVar13 = (CType *)((long)&pCVar23->info + (ulong)((pCVar7->info & 0xffff) << 4));
      if ((pCVar7->info & 0xf0000000) != 0x50000000) {
        pCVar13 = pCVar7;
      }
LAB_00134ffc:
      local_50[uVar18] = pCVar13;
      pTVar10->u64 = (uint64_t)TVar20;
LAB_00135004:
      if (!bVar24) break;
    }
    else {
      if (uVar3 < 0xfffeffff) {
        pCVar13 = pCVar19->tab + 0xe;
        TVar20 = TVar15;
        goto LAB_00134ffc;
      }
      if (uVar3 != 0xfffffffb) {
        if (uVar3 == 0xffffffff) {
          pCVar13 = pCVar19->tab + 0x11;
          TVar20.u64 = 0;
        }
        else {
          pCVar13 = (CType *)0x0;
          TVar20.u64 = 1;
          local_64 = 0;
        }
        goto LAB_00134ffc;
      }
      uVar2 = *(ushort *)((ulong)*(uint *)(TVar15.u64 + lVar6) + 6);
      pCVar13 = pCVar19->tab;
      uVar3 = pCVar13[uVar2].info;
      local_50[uVar18] = (CType *)0x0;
      uVar17 = *(uint *)TVar15;
      pTVar10->u64 = (uint64_t)((GCstr *)(ulong)uVar17 + 1);
      local_64 = 0;
      if ((uVar3 & 0xf0000000) != 0x50000000) goto LAB_00135004;
      pCVar13 = pCVar13 + uVar2;
      pCVar8 = lj_ctype_getfieldq(pCVar19,pCVar13,(GCstr *)(ulong)uVar17,(CTSize *)local_98,
                                  (CTInfo *)0x0);
      pCVar19 = local_78;
      if ((pCVar8 == (CType *)0x0) || ((pCVar8->info & 0xf0000000) != 0xb0000000)) {
        local_50[uVar18 ^ 1] = pCVar13;
        local_60[uVar18 ^ 1].u64 = 0;
        goto LAB_0013544a;
      }
      local_50[uVar18] =
           (CType *)((long)&local_78->tab->info + (ulong)((pCVar8->info & 0xffff) << 4));
      pTVar10->u64 = (uint64_t)&pCVar8->size;
      local_64 = 1;
      if (!bVar24) goto LAB_001350f3;
    }
    pTVar10 = local_60 + 1;
    TVar15.u64 = TVar15.u64 + 8;
    uVar18 = 1;
    lVar6 = -8;
    bVar24 = false;
  } while( true );
  if (local_64 == 0) {
LAB_0013544a:
    plVar22 = local_88;
    pTVar10 = local_88->base;
    mm_00 = (MMS)local_70;
    if ((pTVar10->field_2).it == 0xfffffff5) {
      uVar2 = *(ushort *)((ulong)(pTVar10->u32).lo + 6);
      uVar3 = pCVar19->tab[uVar2].info;
      uVar17 = (uint)uVar2;
      if ((uVar3 & 0xf0000000) == 0x20000000) {
        uVar17 = uVar3 & 0xffff;
      }
      tv = lj_ctype_meta(pCVar19,uVar17,mm_00);
      if (tv != (cTValue *)0x0) goto LAB_001354fa;
      pTVar10 = plVar22->base;
    }
    if ((pTVar10 + 1 < plVar22->top) && (*(int *)((long)pTVar10 + 0xc) == -0xb)) {
      uVar2 = *(ushort *)((ulong)pTVar10[1].u32.lo + 6);
      uVar3 = pCVar19->tab[uVar2].info;
      uVar17 = (uint)uVar2;
      if ((uVar3 & 0xf0000000) == 0x20000000) {
        uVar17 = uVar3 & 0xffff;
      }
      tv = lj_ctype_meta(pCVar19,uVar17,mm_00);
      pCVar19 = local_78;
      if (tv != (cTValue *)0x0) {
LAB_001354fa:
        iVar14 = lj_meta_tailcall(plVar22,tv);
        return iVar14;
      }
    }
    if (mm_00 == MM_eq) {
      iVar14 = (local_60[0].u64 != local_60[1].u64) - 3;
      *(int *)((long)plVar22->top + -4) = iVar14;
      *(int *)((ulong)(plVar22->glref).ptr32 + 0x124) = iVar14;
      return 1;
    }
    lVar6 = 0xffffffff;
    lVar12 = 0;
    lVar16 = 0xffffffff;
    bVar24 = true;
    do {
      bVar21 = bVar24;
      pCVar13 = local_50[lVar12];
      uVar3 = *(uint *)((long)local_88->base + lVar12 * 8 + 4);
      if ((pCVar13 == (CType *)0x0) || (uVar3 != 0xfffffff5)) {
        if (uVar3 == 0xfffffffb) {
          lVar6 = lVar12;
        }
        uVar18 = 0xd;
        if ((0xfffeffff < uVar3) && (uVar18 = 3, (uVar3 & 0xffff8000) != 0xffff0000)) {
          uVar18 = (ulong)~uVar3;
        }
        pGVar11 = (GCstr *)lj_obj_itypename[uVar18];
      }
      else {
        if ((pCVar13->info & 0xf0000000) == 0x50000000) {
          lVar16 = lVar12;
        }
        pGVar11 = lj_ctype_repr(local_88,(CTypeID)((ulong)((long)pCVar13 - (long)pCVar19->tab) >> 4)
                                ,(GCstr *)0x0);
        pGVar11 = pGVar11 + 1;
        pCVar19 = local_78;
      }
      *local_40 = (ulong)pGVar11;
      lVar12 = 1;
      local_40 = local_98 + 1;
      bVar24 = false;
    } while (bVar21);
    if (((uint)lVar6 ^ (uint)lVar16) == 1) {
      local_98[1] = local_98[(int)(uint)lVar16];
      uVar18 = local_98[(int)(uint)lVar6];
      em = LJ_ERR_FFI_BADCONV;
    }
    else {
      uVar18 = local_98[0];
      if ((uint)local_70 == 5) {
        em = LJ_ERR_FFI_BADLEN;
      }
      else if ((uint)local_70 == 8) {
        em = LJ_ERR_FFI_BADCONCAT;
      }
      else {
        em = LJ_ERR_FFI_BADARITH;
        if ((uint)local_70 < 10) {
          em = LJ_ERR_FFI_BADCOMP;
        }
      }
    }
    lj_err_callerv(local_88,em,uVar18,local_98[1]);
  }
LAB_001350f3:
  pCVar13 = local_50[0];
  TVar20 = local_60[1];
  TVar15 = local_60[0];
  uVar3 = (uint)local_70;
  if (((uint)local_70 == 5) || ((uint)local_70 == 8)) goto LAB_0013544a;
  uVar17 = local_50[0]->info;
  if ((0xfffffff < uVar17) ||
     (((8 < local_50[0]->size || (0xfffffff < local_50[1]->info)) || (8 < local_50[1]->size)))) {
    if ((uVar17 & 0xf0000000) == 0x20000000 || (uVar17 & 0xfc000000) == 0x30000000) {
      if ((((uint)local_70 < 0xc) && ((0x8d0U >> ((uint)local_70 & 0x1f) & 1) != 0)) &&
         ((local_50[1]->info & 0xf0000000) == 0x20000000 ||
          (local_50[1]->info & 0xfc000000) == 0x30000000)) {
        if ((uint)local_70 == 4) {
          *(uint *)((long)local_88->top + -4) = (local_60[0].u64 != local_60[1].u64) - 3;
          plVar22 = local_88;
          goto LAB_00135732;
        }
        iVar14 = lj_cconv_compatptr(pCVar19,local_50[0],local_50[1],8);
        pCVar19 = local_78;
        if (iVar14 == 0) goto LAB_0013544a;
        if (uVar3 == 0xb) {
          CVar5 = lj_ctype_size(local_78,(uint)(ushort)pCVar13->info);
          pCVar19 = local_78;
          if (1 < CVar5 + 1) {
            local_88->top[-1].n =
                 (double)(int)((long)(TVar15.u64 - (long)TVar20) / (long)(int)CVar5);
            plVar22 = local_88;
            goto LAB_00135732;
          }
          goto LAB_0013544a;
        }
        pTVar10 = local_88->top;
        if (uVar3 == 6) {
          iVar14 = -2 - (uint)(TVar15.u64 < TVar20.u64);
        }
        else {
          iVar14 = (TVar20.u64 < TVar15.u64) - 3;
        }
        goto LAB_00135620;
      }
      if ((((uint)local_70 & 0xfffffffe) == 10) && (local_50[1]->info < 0x10000000)) {
        lj_cconv_ct_ct(pCVar19,pCVar19->tab + 0xb,local_50[1],(uint8_t *)local_98,
                       (uint8_t *)local_60[1],0);
        pCVar19 = local_78;
        if (uVar3 == 0xb) {
          local_98[0] = -local_98[0];
        }
        goto LAB_00135387;
      }
    }
    else if (((uint)local_70 == 10 && uVar17 < 0x10000000) &&
            ((local_50[1]->info & 0xf0000000) == 0x20000000 ||
             (local_50[1]->info & 0xfc000000) == 0x30000000)) {
      lj_cconv_ct_ct(pCVar19,pCVar19->tab + 0xb,local_50[0],(uint8_t *)local_98,
                     (uint8_t *)local_60[0],0);
      TVar15 = TVar20;
      pCVar13 = local_50[1];
LAB_00135387:
      CVar5 = lj_ctype_size(pCVar19,(uint)(ushort)pCVar13->info);
      if (CVar5 != 0xffffffff) {
        lVar6 = (long)(int)CVar5 * local_98[0];
        CVar4 = lj_ctype_intern(pCVar19,(ushort)pCVar13->info | 0x20030000,8);
        pvVar9 = lj_mem_newgco(pCVar19->L,0x10);
        *(undefined1 *)((long)pvVar9 + 5) = 10;
        *(short *)((long)pvVar9 + 6) = (short)CVar4;
        plVar1 = (long *)((ulong)(pCVar19->L->glref).ptr32 + 0xe0);
        *plVar1 = *plVar1 + 1;
        *(uint8_t **)((long)pvVar9 + 8) = (uint8_t *)(TVar15.u64 + lVar6);
        pTVar10 = local_88->top;
        pTVar10[-1].u32.lo = (uint32_t)pvVar9;
        *(undefined4 *)((long)pTVar10 + -4) = 0xfffffff5;
        plVar22 = local_88;
        goto switchD_00135200_default;
      }
    }
    goto LAB_0013544a;
  }
  iVar14 = 0xc;
  if ((((byte)(uVar17 >> 0x17) & local_50[0]->size == 8) == 0) &&
     (iVar14 = 0xb, (local_50[1]->info >> 0x17 & 1) != 0)) {
    iVar14 = (local_50[1]->size == 8) + 0xb;
  }
  pCVar13 = (CType *)((long)&pCVar19->tab->info + (ulong)(uint)(iVar14 << 4));
  lj_cconv_ct_ct(pCVar19,pCVar13,local_50[0],(uint8_t *)local_98,(uint8_t *)local_60[0],0);
  plVar22 = local_88;
  if (uVar3 != 0x10) {
    lj_cconv_ct_ct(pCVar19,pCVar13,local_50[1],(uint8_t *)&local_80,(uint8_t *)local_60[1],0);
    if (uVar3 == 7) {
      bVar21 = (long)local_98[0] <= (long)local_80;
      bVar24 = local_98[0] <= local_80;
LAB_0013560c:
      if (iVar14 == 0xb) {
        bVar24 = bVar21;
      }
      iVar14 = -2 - (uint)bVar24;
    }
    else {
      if (uVar3 == 6) {
        bVar24 = local_98[0] < local_80;
        bVar21 = (long)local_98[0] < (long)local_80;
        goto LAB_0013560c;
      }
      pCVar19 = local_78;
      if (uVar3 != 4) goto LAB_001351ae;
      iVar14 = (local_98[0] != local_80) - 3;
    }
    pTVar10 = plVar22->top;
    local_88 = plVar22;
LAB_00135620:
    *(int *)((long)pTVar10 + -4) = iVar14;
    plVar22 = local_88;
    goto LAB_00135732;
  }
LAB_001351ae:
  pvVar9 = lj_mem_newgco(pCVar19->L,0x10);
  *(undefined1 *)((long)pvVar9 + 5) = 10;
  *(short *)((long)pvVar9 + 6) = (short)iVar14;
  plVar1 = (long *)((ulong)(pCVar19->L->glref).ptr32 + 0xe0);
  *plVar1 = *plVar1 + 1;
  pTVar10 = plVar22->top;
  pTVar10[-1].u32.lo = (uint32_t)pvVar9;
  *(undefined4 *)((long)pTVar10 + -4) = 0xfffffff5;
  switch(uVar3) {
  case 10:
    uVar18 = local_80 + local_98[0];
    break;
  case 0xb:
    uVar18 = local_98[0] - local_80;
    break;
  case 0xc:
    uVar18 = local_80 * local_98[0];
    break;
  case 0xd:
    uVar18 = 0x8000000000000000;
    if (iVar14 == 0xb) {
      if ((local_80 != 0) && (local_80 != 0xffffffffffffffff || local_98[0] != 0x8000000000000000))
      {
        uVar18 = (long)local_98[0] / (long)local_80;
      }
    }
    else if (local_80 != 0) {
      uVar18 = local_98[0] / local_80;
    }
    break;
  case 0xe:
    if (iVar14 == 0xb) {
      uVar18 = 0x8000000000000000;
      if (local_80 != 0) {
        if (local_80 == 0xffffffffffffffff && local_98[0] == 0x8000000000000000) {
          uVar18 = 0;
        }
        else {
          uVar18 = (long)local_98[0] % (long)local_80;
        }
      }
    }
    else if (local_80 == 0) {
      uVar18 = 0x8000000000000000;
    }
    else {
      uVar18 = local_98[0] % local_80;
    }
    break;
  case 0xf:
    if (iVar14 == 0xb) {
      uVar18 = lj_carith_powi64(local_98[0],local_80);
    }
    else {
      uVar18 = lj_carith_powu64(local_98[0],local_80);
    }
    break;
  case 0x10:
    uVar18 = -local_98[0];
    break;
  default:
    goto switchD_00135200_default;
  }
  *(ulong *)((long)pvVar9 + 8) = uVar18;
switchD_00135200_default:
  uVar18 = (ulong)(plVar22->glref).ptr32;
  if (*(uint *)(uVar18 + 0x54) <= *(uint *)(uVar18 + 0x50)) {
    lj_gc_step(plVar22);
  }
LAB_00135732:
  *(TValue *)((ulong)(plVar22->glref).ptr32 + 0x120) = plVar22->top[-1];
  return 1;
}

Assistant:

int lj_carith_op(lua_State *L, MMS mm)
{
  CTState *cts = ctype_cts(L);
  CDArith ca;
  if (carith_checkarg(L, cts, &ca) && mm != MM_len && mm != MM_concat) {
    if (carith_int64(L, cts, &ca, mm) || carith_ptr(L, cts, &ca, mm)) {
      copyTV(L, &G(L)->tmptv2, L->top-1);  /* Remember for trace recorder. */
      return 1;
    }
  }
  return lj_carith_meta(L, cts, &ca, mm);
}